

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharTrie.cpp
# Opt level: O1

bool __thiscall UnifiedRegex::CharTrie::IsDepthOne(CharTrie *this)

{
  int iVar1;
  int iVar2;
  CharTrieEntry *pCVar3;
  int iVar4;
  bool bVar5;
  int *piVar6;
  int iVar7;
  
  if (this->isAccepting == false) {
    iVar1 = this->count;
    bVar5 = iVar1 < 1;
    if (0 < iVar1) {
      pCVar3 = this->children;
      if (((pCVar3->node).isAccepting == true) && ((pCVar3->node).count == 0)) {
        piVar6 = &pCVar3[1].node.count;
        iVar4 = 1;
        do {
          iVar7 = iVar4;
          if ((iVar1 == iVar7) || (*(bool *)(piVar6 + -2) != true)) break;
          iVar2 = *piVar6;
          piVar6 = piVar6 + 8;
          iVar4 = iVar7 + 1;
        } while (iVar2 == 0);
        bVar5 = iVar1 <= iVar7;
      }
      return bVar5;
    }
  }
  else {
    bVar5 = false;
  }
  return bVar5;
}

Assistant:

bool CharTrie::IsDepthOne() const
    {
        if (isAccepting)
            return 0;
        for (int i = 0; i < count; i++)
        {
            if (!children[i].node.IsDepthZero())
                return false;
        }
        return true;
    }